

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

PoolingLayerParams_ValidCompletePadding * __thiscall
CoreML::Specification::PoolingLayerParams_ValidCompletePadding::New
          (PoolingLayerParams_ValidCompletePadding *this,Arena *arena)

{
  PoolingLayerParams_ValidCompletePadding *this_00;
  
  this_00 = (PoolingLayerParams_ValidCompletePadding *)operator_new(0x28);
  PoolingLayerParams_ValidCompletePadding(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::PoolingLayerParams_ValidCompletePadding>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

PoolingLayerParams_ValidCompletePadding* PoolingLayerParams_ValidCompletePadding::New(::google::protobuf::Arena* arena) const {
  PoolingLayerParams_ValidCompletePadding* n = new PoolingLayerParams_ValidCompletePadding;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}